

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall google::protobuf::io::CodedOutputStream::HadError(CodedOutputStream *this)

{
  bool bVar1;
  uint8_t *puVar2;
  LogMessage *pLVar3;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  CodedOutputStream *local_10;
  CodedOutputStream *this_local;
  
  local_10 = this;
  puVar2 = EpsCopyOutputStream::FlushAndResetBuffer(&this->impl_,this->cur_);
  this->cur_ = puVar2;
  if (this->cur_ != (uint8_t *)0x0) {
    bVar1 = EpsCopyOutputStream::HadError(&this->impl_);
    return bVar1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"cur_");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
             ,0x426,local_38._M_len,local_38._M_str);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
}

Assistant:

bool HadError() {
    cur_ = impl_.FlushAndResetBuffer(cur_);
    ABSL_DCHECK(cur_);
    return impl_.HadError();
  }